

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O1

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks)

{
  curl_socket_t __fd;
  int iVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  int reuse;
  curl_socklen_t addrlen;
  anon_union_16_2_022c54a6 a;
  char data [2] [12];
  undefined4 local_60;
  socklen_t local_5c;
  sockaddr local_58;
  char local_48 [12];
  undefined1 local_3c [20];
  
  local_5c = 0x10;
  local_60 = 1;
  __fd = socket(2,1,6);
  if (__fd == -1) {
    return -1;
  }
  local_58.sa_data[6] = '\0';
  local_58.sa_data[7] = '\0';
  local_58.sa_data[8] = '\0';
  local_58.sa_data[9] = '\0';
  local_58.sa_data[10] = '\0';
  local_58.sa_data[0xb] = '\0';
  local_58.sa_data[0xc] = '\0';
  local_58.sa_data[0xd] = '\0';
  local_58.sa_family = 2;
  local_58.sa_data[0] = '\0';
  local_58.sa_data[1] = '\0';
  local_58.sa_data[2] = '\x7f';
  local_58.sa_data[3] = '\0';
  local_58.sa_data[4] = '\0';
  local_58.sa_data[5] = '\x01';
  socks[0] = -1;
  socks[1] = -1;
  iVar1 = setsockopt(__fd,1,2,&local_60,4);
  if ((((iVar1 != -1) && (iVar1 = bind(__fd,&local_58,0x10), iVar1 != -1)) &&
      (iVar1 = getsockname(__fd,&local_58,&local_5c), iVar1 != -1)) &&
     (iVar1 = listen(__fd,1), iVar1 != -1)) {
    iVar1 = socket(2,1,0);
    *socks = iVar1;
    if ((iVar1 != -1) && (iVar1 = connect(iVar1,&local_58,0x10), iVar1 != -1)) {
      iVar1 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
      socks[1] = iVar1;
      if (iVar1 != -1) {
        curl_msnprintf(local_48,0xc,"%p",socks);
        __n = strlen(local_48);
        sVar3 = send(*socks,local_48,__n,0x4000);
        if (sVar3 == __n) {
          iVar1 = 0;
          sVar3 = recv(socks[1],local_3c,0xc,0);
          if ((sVar3 == __n) && (iVar2 = bcmp(local_48,local_3c,__n), iVar2 == 0))
          goto LAB_00141e39;
        }
      }
    }
  }
  close(__fd);
  close(*socks);
  __fd = socks[1];
  iVar1 = -1;
LAB_00141e39:
  close(__fd);
  return iVar1;
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2])
{
  union {
    struct sockaddr_in inaddr;
    struct sockaddr addr;
  } a;
  curl_socket_t listener;
  curl_socklen_t addrlen = sizeof(a.inaddr);
  int reuse = 1;
  char data[2][12];
  ssize_t dlen;
  (void)domain;
  (void)type;
  (void)protocol;

  listener = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  if(listener == CURL_SOCKET_BAD)
    return -1;

  memset(&a, 0, sizeof(a));
  a.inaddr.sin_family = AF_INET;
  a.inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  a.inaddr.sin_port = 0;

  socks[0] = socks[1] = CURL_SOCKET_BAD;

  if(setsockopt(listener, SOL_SOCKET, SO_REUSEADDR,
                (char *)&reuse, (curl_socklen_t)sizeof(reuse)) == -1)
    goto error;
  if(bind(listener, &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  if(getsockname(listener, &a.addr, &addrlen) == -1)
    goto error;
  if(listen(listener, 1) == -1)
    goto error;
  socks[0] = socket(AF_INET, SOCK_STREAM, 0);
  if(socks[0] == CURL_SOCKET_BAD)
    goto error;
  if(connect(socks[0], &a.addr, sizeof(a.inaddr)) == -1)
    goto error;
  socks[1] = accept(listener, NULL, NULL);
  if(socks[1] == CURL_SOCKET_BAD)
    goto error;

  /* verify that nothing else connected */
  msnprintf(data[0], sizeof(data[0]), "%p", socks);
  dlen = strlen(data[0]);
  if(swrite(socks[0], data[0], dlen) != dlen)
    goto error;
  if(sread(socks[1], data[1], sizeof(data[1])) != dlen)
    goto error;
  if(memcmp(data[0], data[1], dlen))
    goto error;

  sclose(listener);
  return 0;

  error:
  sclose(listener);
  sclose(socks[0]);
  sclose(socks[1]);
  return -1;
}